

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O1

void __thiscall
dynet::PickElement::forward_dev_impl<dynet::Device_CPU>
          (PickElement *this,Device_CPU *dev,
          vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *xs,Tensor *fx)

{
  uint lindex;
  Tensor *pTVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined8 uVar6;
  byte bVar7;
  byte bVar8;
  pointer puVar9;
  ostream *poVar10;
  pointer ppTVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  ushort uVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  int iVar23;
  
  if (this->pval != (uint *)0x0) {
    lindex = *this->pval;
    pTVar1 = *(xs->super__Vector_base<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if (lindex < (pTVar1->d).d[0]) {
      TensorTools::CopyElement(pTVar1,lindex,fx,0);
      return;
    }
    poVar10 = std::operator<<((ostream *)&std::cerr,"PickElement::forward_impl requested element ");
    poVar10 = (ostream *)std::ostream::operator<<(poVar10,*this->pval);
    poVar10 = std::operator<<(poVar10," from a vector of length ");
    ppTVar11 = (xs->
               super__Vector_base<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>).
               _M_impl.super__Vector_impl_data._M_start;
LAB_00352520:
    poVar10 = (ostream *)std::ostream::operator<<(poVar10,((*ppTVar11)->d).d[0]);
    std::endl<char,std::char_traits<char>>(poVar10);
    abort();
  }
  pvVar2 = this->pvals;
  if (pvVar2 == (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    __assert_fail("pvals",
                  "/workspace/llm4binary/github/license_c_cmakelists/trevorcohn[P]mantis/dynet/dynet/nodes.cc"
                  ,0x546,
                  "void dynet::PickElement::forward_dev_impl(const MyDevice &, const vector<const Tensor *> &, Tensor &) const [MyDevice = dynet::Device_CPU]"
                 );
  }
  if ((long)(pvVar2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(pvVar2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start >> 2 != (ulong)(fx->d).bd) {
    __assert_fail("pvals->size() == fx.d.batch_elems()",
                  "/workspace/llm4binary/github/license_c_cmakelists/trevorcohn[P]mantis/dynet/dynet/nodes.cc"
                  ,0x547,
                  "void dynet::PickElement::forward_dev_impl(const MyDevice &, const vector<const Tensor *> &, Tensor &) const [MyDevice = dynet::Device_CPU]"
                 );
  }
  pTVar1 = *(xs->super__Vector_base<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  uVar12 = (ulong)(pTVar1->d).nd;
  if (uVar12 == 0) {
    iVar23 = 1;
  }
  else {
    auVar17 = vpbroadcastq_avx512f();
    auVar18 = vpbroadcastd_avx512f(ZEXT416(1));
    uVar13 = 0;
    auVar19 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar20 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      auVar21 = vmovdqa64_avx512f(auVar18);
      auVar18 = vpbroadcastq_avx512f();
      auVar22 = vporq_avx512f(auVar18,auVar19);
      auVar18 = vporq_avx512f(auVar18,auVar20);
      uVar6 = vpcmpuq_avx512f(auVar18,auVar17,2);
      bVar7 = (byte)uVar6;
      uVar6 = vpcmpuq_avx512f(auVar22,auVar17,2);
      bVar8 = (byte)uVar6;
      uVar15 = CONCAT11(bVar8,bVar7);
      auVar18 = vmovdqu32_avx512f(*(undefined1 (*) [64])((pTVar1->d).d + uVar13));
      auVar22._4_4_ = (uint)((byte)(uVar15 >> 1) & 1) * auVar18._4_4_;
      auVar22._0_4_ = (uint)(bVar7 & 1) * auVar18._0_4_;
      auVar22._8_4_ = (uint)((byte)(uVar15 >> 2) & 1) * auVar18._8_4_;
      auVar22._12_4_ = (uint)((byte)(uVar15 >> 3) & 1) * auVar18._12_4_;
      auVar22._16_4_ = (uint)((byte)(uVar15 >> 4) & 1) * auVar18._16_4_;
      auVar22._20_4_ = (uint)((byte)(uVar15 >> 5) & 1) * auVar18._20_4_;
      auVar22._24_4_ = (uint)((byte)(uVar15 >> 6) & 1) * auVar18._24_4_;
      auVar22._28_4_ = (uint)((byte)(uVar15 >> 7) & 1) * auVar18._28_4_;
      auVar22._32_4_ = (uint)(bVar8 & 1) * auVar18._32_4_;
      auVar22._36_4_ = (uint)(bVar8 >> 1 & 1) * auVar18._36_4_;
      auVar22._40_4_ = (uint)(bVar8 >> 2 & 1) * auVar18._40_4_;
      auVar22._44_4_ = (uint)(bVar8 >> 3 & 1) * auVar18._44_4_;
      auVar22._48_4_ = (uint)(bVar8 >> 4 & 1) * auVar18._48_4_;
      auVar22._52_4_ = (uint)(bVar8 >> 5 & 1) * auVar18._52_4_;
      auVar22._56_4_ = (uint)(bVar8 >> 6 & 1) * auVar18._56_4_;
      auVar22._60_4_ = (uint)(bVar8 >> 7) * auVar18._60_4_;
      auVar18 = vpmulld_avx512f(auVar22,auVar21);
      uVar13 = uVar13 + 0x10;
    } while ((uVar12 + 0xf & 0xfffffffffffffff0) != uVar13);
    auVar17 = vmovdqa32_avx512f(auVar18);
    auVar18._0_4_ = (uint)(bVar7 & 1) * auVar17._0_4_ | (uint)!(bool)(bVar7 & 1) * auVar21._0_4_;
    bVar3 = (bool)((byte)(uVar15 >> 1) & 1);
    auVar18._4_4_ = (uint)bVar3 * auVar17._4_4_ | (uint)!bVar3 * auVar21._4_4_;
    bVar3 = (bool)((byte)(uVar15 >> 2) & 1);
    auVar18._8_4_ = (uint)bVar3 * auVar17._8_4_ | (uint)!bVar3 * auVar21._8_4_;
    bVar3 = (bool)((byte)(uVar15 >> 3) & 1);
    auVar18._12_4_ = (uint)bVar3 * auVar17._12_4_ | (uint)!bVar3 * auVar21._12_4_;
    bVar3 = (bool)((byte)(uVar15 >> 4) & 1);
    auVar18._16_4_ = (uint)bVar3 * auVar17._16_4_ | (uint)!bVar3 * auVar21._16_4_;
    bVar3 = (bool)((byte)(uVar15 >> 5) & 1);
    auVar18._20_4_ = (uint)bVar3 * auVar17._20_4_ | (uint)!bVar3 * auVar21._20_4_;
    bVar3 = (bool)((byte)(uVar15 >> 6) & 1);
    auVar18._24_4_ = (uint)bVar3 * auVar17._24_4_ | (uint)!bVar3 * auVar21._24_4_;
    bVar3 = (bool)((byte)(uVar15 >> 7) & 1);
    auVar18._28_4_ = (uint)bVar3 * auVar17._28_4_ | (uint)!bVar3 * auVar21._28_4_;
    auVar18._32_4_ = (uint)(bVar8 & 1) * auVar17._32_4_ | (uint)!(bool)(bVar8 & 1) * auVar21._32_4_;
    bVar3 = (bool)(bVar8 >> 1 & 1);
    auVar18._36_4_ = (uint)bVar3 * auVar17._36_4_ | (uint)!bVar3 * auVar21._36_4_;
    bVar3 = (bool)(bVar8 >> 2 & 1);
    auVar18._40_4_ = (uint)bVar3 * auVar17._40_4_ | (uint)!bVar3 * auVar21._40_4_;
    bVar3 = (bool)(bVar8 >> 3 & 1);
    auVar18._44_4_ = (uint)bVar3 * auVar17._44_4_ | (uint)!bVar3 * auVar21._44_4_;
    bVar3 = (bool)(bVar8 >> 4 & 1);
    auVar18._48_4_ = (uint)bVar3 * auVar17._48_4_ | (uint)!bVar3 * auVar21._48_4_;
    bVar3 = (bool)(bVar8 >> 5 & 1);
    auVar18._52_4_ = (uint)bVar3 * auVar17._52_4_ | (uint)!bVar3 * auVar21._52_4_;
    bVar3 = (bool)(bVar8 >> 6 & 1);
    auVar18._56_4_ = (uint)bVar3 * auVar17._56_4_ | (uint)!bVar3 * auVar21._56_4_;
    auVar18._60_4_ =
         (uint)(bVar8 >> 7) * auVar17._60_4_ | (uint)!(bool)(bVar8 >> 7) * auVar21._60_4_;
    auVar16 = vextracti64x4_avx512f(auVar18,1);
    auVar17 = vpmulld_avx512f(auVar18,ZEXT3264(auVar16));
    auVar4 = vpmulld_avx(auVar17._0_16_,auVar17._16_16_);
    auVar5 = vpshufd_avx(auVar4,0xee);
    auVar4 = vpmulld_avx(auVar4,auVar5);
    auVar5 = vpshufd_avx(auVar4,0x55);
    auVar4 = vpmulld_avx(auVar4,auVar5);
    iVar23 = auVar4._0_4_;
  }
  puVar9 = (this->pvals->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->pvals->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar9) {
    iVar14 = 0;
    uVar12 = 0;
    do {
      pTVar1 = *(xs->
                super__Vector_base<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
      if ((pTVar1->d).d[0] <= puVar9[uVar12]) {
        poVar10 = std::operator<<((ostream *)&std::cerr,
                                  "PickElement::forward_impl requested element ");
        poVar10 = (ostream *)
                  std::ostream::operator<<
                            (poVar10,(this->pvals->
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     )._M_impl.super__Vector_impl_data._M_start[uVar12]);
        poVar10 = std::operator<<(poVar10," from a vector of length ");
        ppTVar11 = (xs->
                   super__Vector_base<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>
                   )._M_impl.super__Vector_impl_data._M_start;
        goto LAB_00352520;
      }
      TensorTools::CopyElement(pTVar1,puVar9[uVar12] + iVar14,fx,(int)uVar12);
      uVar12 = (ulong)((int)uVar12 + 1);
      puVar9 = (this->pvals->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
               _M_impl.super__Vector_impl_data._M_start;
      iVar14 = iVar14 + iVar23;
    } while (uVar12 < (ulong)((long)(this->pvals->
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)puVar9 >> 2))
    ;
  }
  return;
}

Assistant:

void PickElement::forward_dev_impl(const MyDevice & dev, const vector<const Tensor*>& xs, Tensor& fx) const {
  if(pval) {
    if (*pval >= xs[0]->d.rows()) {
      cerr << "PickElement::forward_impl requested element " << *pval
           << " from a vector of length " << xs[0]->d.rows() << endl;
      abort();
    }
    TensorTools::CopyElement(*xs[0], *pval, fx, 0);
  } else {
    assert(pvals);
    assert(pvals->size() == fx.d.batch_elems());
    int batch_size = xs[0]->d.batch_size();
    for(unsigned b = 0; b < pvals->size(); ++b) {
      if ((*pvals)[b] >= xs[0]->d.rows()) {
        cerr << "PickElement::forward_impl requested element " << (*pvals)[b]
             << " from a vector of length " << xs[0]->d.rows() << endl;
        abort();
      }
      TensorTools::CopyElement(*xs[0], b*batch_size + (*pvals)[b], fx, b);
    }
  }
}